

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_IteratorGetCompleteValue(JSContext *ctx,JSValue obj,BOOL *pdone)

{
  int iVar1;
  JSValue JVar2;
  
  JVar2 = JS_GetPropertyInternal(ctx,obj,0x69,obj,0);
  if ((int)JVar2.tag != 6) {
    iVar1 = JS_ToBoolFree(ctx,JVar2);
    JVar2 = JS_GetPropertyInternal(ctx,obj,0x40,obj,0);
    if ((int)JVar2.tag != 6) goto LAB_00139eaf;
  }
  iVar1 = 0;
  JVar2 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00139eaf:
  *pdone = iVar1;
  return JVar2;
}

Assistant:

static JSValue JS_IteratorGetCompleteValue(JSContext *ctx, JSValueConst obj,
                                           BOOL *pdone)
{
    JSValue done_val, value;
    BOOL done;
    done_val = JS_GetProperty(ctx, obj, JS_ATOM_done);
    if (JS_IsException(done_val))
        goto fail;
    done = JS_ToBoolFree(ctx, done_val);
    value = JS_GetProperty(ctx, obj, JS_ATOM_value);
    if (JS_IsException(value))
        goto fail;
    *pdone = done;
    return value;
 fail:
    *pdone = FALSE;
    return JS_EXCEPTION;
}